

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdSetPsbtRedeemScript
              (void *handle,void *psbt_handle,int type,uint32_t index,char *redeem_script)

{
  Psbt *this;
  bool bVar1;
  CfdException *pCVar2;
  int type_local;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  AbstractTxOutReference local_b0;
  Script script;
  
  type_local = type;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&txout,"PsbtHandle",(allocator *)&local_b0);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  bVar1 = cfd::capi::IsEmptyString(redeem_script);
  if (bVar1) {
    txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fd756;
    txout.super_AbstractTxOut.value_.amount_._0_4_ = 0x887;
    txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_7cbbcb;
    cfd::core::logger::warn<>((CfdSourceLocation *)&txout,"redeem_script is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&txout,"Failed to parameter. redeem_script is null or empty.",
               (allocator *)&local_b0);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&txout);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&txout,redeem_script,(allocator *)&local_b0);
    cfd::core::Script::Script(&script,(string *)&txout);
    std::__cxx11::string::~string((string *)&txout);
    key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (type == 2) {
      cfd::core::Psbt::GetTxInUtxo
                (&txout,*(Psbt **)((long)psbt_handle + 0x18),index,false,(bool *)0x0);
      this = *(Psbt **)((long)psbt_handle + 0x18);
      cfd::core::TxOutReference::TxOutReference((TxOutReference *)&local_b0,&txout);
      cfd::core::Psbt::SetTxInUtxo(this,index,(TxOutReference *)&local_b0,&script,&key_list);
      cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&local_b0);
      cfd::core::AbstractTxOut::~AbstractTxOut(&txout.super_AbstractTxOut);
    }
    else {
      if (type != 3) {
        txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fd756;
        txout.super_AbstractTxOut.value_.amount_._0_4_ = 0x89f;
        txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_7cbbcb;
        cfd::core::logger::warn<int&>((CfdSourceLocation *)&txout,"type is invalid: {}",&type_local)
        ;
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&txout,"Failed to parameter. type is invalid.",(allocator *)&local_b0);
        cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&txout);
        __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      cfd::core::Psbt::SetTxOutData(*(Psbt **)((long)psbt_handle + 0x18),index,&script,&key_list);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
    cfd::core::Script::~Script(&script);
    return 0;
  }
  txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fd756;
  txout.super_AbstractTxOut.value_.amount_._0_4_ = 0x88d;
  txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_7cbbcb;
  cfd::core::logger::warn<>((CfdSourceLocation *)&txout,"psbt is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&txout,"Failed to handle statement. psbt is null.",(allocator *)&local_b0);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&txout);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetPsbtRedeemScript(
    void* handle, void* psbt_handle, int type, uint32_t index,
    const char* redeem_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeem_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeem_script is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script(redeem_script);
    std::vector<KeyData> key_list;
    switch (type) {
      case kCfdPsbtRecordTypeInput: {
        auto txout = psbt_obj->psbt->GetTxInUtxo(index);
        psbt_obj->psbt->SetTxInUtxo(
            index, TxOutReference(txout), script, key_list);
      } break;
      case kCfdPsbtRecordTypeOutput:
        psbt_obj->psbt->SetTxOutData(index, script, key_list);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}